

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

void Curl_ssl_adjust_pollset(Curl_cfilter *cf,Curl_easy *data,easy_pollset *ps)

{
  void *pvVar1;
  curl_socket_t sock;
  int add_flags;
  int iStack_20;
  
  if ((cf->field_0x24 & 1) == 0) {
    pvVar1 = cf->ctx;
    sock = Curl_conn_cf_get_socket(cf->next,data);
    if (sock != -1) {
      if (*(int *)((long)pvVar1 + 4) == 3) {
        add_flags = 2;
        iStack_20 = 1;
      }
      else {
        add_flags = 1;
        iStack_20 = 2;
      }
      Curl_pollset_change(data,ps,sock,add_flags,iStack_20);
      return;
    }
  }
  return;
}

Assistant:

void Curl_ssl_adjust_pollset(struct Curl_cfilter *cf, struct Curl_easy *data,
                              struct easy_pollset *ps)
{
  if(!cf->connected) {
    struct ssl_connect_data *connssl = cf->ctx;
    curl_socket_t sock = Curl_conn_cf_get_socket(cf->next, data);
    if(sock != CURL_SOCKET_BAD) {
      if(connssl->connecting_state == ssl_connect_2_writing) {
        Curl_pollset_set_out_only(data, ps, sock);
      }
      else {
        Curl_pollset_set_in_only(data, ps, sock);
      }
    }
  }
}